

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O2

void __thiscall
pbrt::GBufferFilm::WriteImage(GBufferFilm *this,ImageMetadata *metadata,Float splatScale)

{
  Image image;
  string sStack_c8;
  Image local_a8;
  
  GetImage(&local_a8,this,metadata,splatScale);
  if (LOGGING_LogLevel < 1) {
    Log<std::__cxx11::string&,pbrt::Bounds2<int>&>
              (Verbose,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/film.cpp"
               ,0x281,"Writing image %s with bounds %s",&(this->super_FilmBase).filename,
               &(this->super_FilmBase).pixelBounds);
  }
  std::__cxx11::string::string((string *)&sStack_c8,(string *)&(this->super_FilmBase).filename);
  Image::Write(&local_a8,&sStack_c8,metadata);
  std::__cxx11::string::~string((string *)&sStack_c8);
  Image::~Image(&local_a8);
  return;
}

Assistant:

void GBufferFilm::WriteImage(ImageMetadata metadata, Float splatScale) {
    Image image = GetImage(&metadata, splatScale);
    LOG_VERBOSE("Writing image %s with bounds %s", filename, pixelBounds);
    image.Write(filename, metadata);
}